

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

int hostcache_timestamp_remove(void *datap,void *hc)

{
  undefined1 local_29;
  Curl_dns_entry *c;
  hostcache_prune_data *data;
  void *hc_local;
  void *datap_local;
  
  local_29 = false;
  if (*(long *)((long)hc + 8) != 0) {
    local_29 = *datap <= *(long *)((long)datap + 8) - *(long *)((long)hc + 8);
  }
  return (int)local_29;
}

Assistant:

static int
hostcache_timestamp_remove(void *datap, void *hc)
{
  struct hostcache_prune_data *data =
    (struct hostcache_prune_data *) datap;
  struct Curl_dns_entry *c = (struct Curl_dns_entry *) hc;

  return (0 != c->timestamp)
    && (data->now - c->timestamp >= data->cache_timeout);
}